

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *
fmt::v10::detail::
make_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  size_t sVar1;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *in_RDI;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *arg;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>
  *in_stack_ffffffffffffff58;
  basic_string_view<char> *this;
  undefined1 local_69;
  char *local_68;
  size_t local_60;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  char *local_48 [3];
  undefined1 *local_30;
  basic_string_view<char> local_28;
  char **local_18;
  basic_string_view<char> local_10;
  
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (in_stack_ffffffffffffff58);
  in_RDI->type_ = string_type;
  local_51 = 1;
  local_52 = 1;
  local_53 = 1;
  local_30 = &local_69;
  local_28 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x2e4bb1);
  local_68 = local_28.data_;
  local_60 = local_28.size_;
  local_10.data_ = local_28.data_;
  local_10.size_ = local_28.size_;
  local_18 = local_48;
  this = &local_10;
  local_48[0] = basic_string_view<char>::data(this);
  sVar1 = basic_string_view<char>::size(this);
  (in_RDI->value_).field_0.string.data = local_48[0];
  (in_RDI->value_).field_0.string.size = sVar1;
  return in_RDI;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T& val) -> basic_format_arg<Context> {
  auto arg = basic_format_arg<Context>();
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_arg<true, Context>(val);
  return arg;
}